

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O0

void __thiscall OpenMD::SCDOrderParameter::process(SCDOrderParameter *this)

{
  int iVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  size_type sVar4;
  reference pvVar5;
  DumpReader *pDVar6;
  long in_RDI;
  RealType RVar7;
  size_t j_1;
  int nProcessed;
  size_t j;
  int i;
  int nFrames;
  DumpReader reader;
  DumpReader *in_stack_ffffffffffffed30;
  DumpReader *this_01;
  DumpReader *local_1290;
  ulong local_1280;
  int local_1278;
  int in_stack_ffffffffffffedbc;
  DumpReader *in_stack_ffffffffffffedc0;
  Snapshot *in_stack_ffffffffffffee98;
  SCDElem *in_stack_ffffffffffffeea0;
  string *in_stack_ffffffffffffef80;
  SimInfo *in_stack_ffffffffffffef88;
  DumpReader *in_stack_ffffffffffffef90;
  SCDOrderParameter *in_stack_fffffffffffff020;
  
  DumpReader::DumpReader
            (in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  iVar2 = DumpReader::getNFrames(in_stack_ffffffffffffed30);
  for (local_1278 = 0; local_1278 < iVar2; local_1278 = *(int *)(in_RDI + 0x30) + local_1278) {
    DumpReader::readFrame(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedbc);
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 0xf8) = pSVar3;
    local_1280 = 0;
    while( true ) {
      sVar4 = std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::size
                        ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)(in_RDI + 200)
                        );
      if (sVar4 <= local_1280) break;
      std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::operator[]
                ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)(in_RDI + 200),
                 local_1280);
      RVar7 = SCDElem::calcSCD(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe0),local_1280);
      *pvVar5 = RVar7 + *pvVar5;
      local_1280 = local_1280 + 1;
    }
  }
  iVar1 = *(int *)(in_RDI + 0x30);
  local_1290 = (DumpReader *)0x0;
  while( true ) {
    this_01 = local_1290;
    pDVar6 = (DumpReader *)
             std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::size
                       ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)(in_RDI + 200))
    ;
    if (pDVar6 <= this_01) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe0),
                        (size_type)local_1290);
    *pvVar5 = *pvVar5 / (double)(iVar2 / iVar1);
    local_1290 = (DumpReader *)((long)&local_1290->info_ + 1);
  }
  writeSCD(in_stack_fffffffffffff020);
  DumpReader::~DumpReader(this_01);
  return;
}

Assistant:

void SCDOrderParameter::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (std::size_t j = 0; j < scdElems_.size(); ++j) {
        scdParam_[j] += scdElems_[j].calcSCD(currentSnapshot_);
      }
    }

    int nProcessed = nFrames / step_;
    for (std::size_t j = 0; j < scdElems_.size(); ++j) {
      scdParam_[j] /= nProcessed;
    }

    writeSCD();
  }